

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_graph.cpp
# Opt level: O2

void __thiscall
HawkTracer::client::CallGraph::_add_new_calltree(CallGraph *this,NodeData *node_data)

{
  undefined1 local_28 [16];
  
  local_28._0_8_ = (pointer)0x0;
  local_28._8_8_ = (pointer)0x0;
  _add_new_call((CallGraph *)&stack0xffffffffffffffe8,node_data,
                (shared_ptr<HawkTracer::client::CallGraph::TreeNode> *)node_data,
                (vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
                 *)local_28);
  std::__shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_current_call).
              super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
             ,(__shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)
              &stack0xffffffffffffffe8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffff0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
  return;
}

Assistant:

void CallGraph::_add_new_calltree(const NodeData& node_data)
{
    _current_call = _add_new_call(node_data, nullptr, _root_calls);
}